

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIf.c
# Opt level: O3

void If_ManComputeSwitching(If_Man_t *pIfMan)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  int iVar4;
  uint uVar5;
  Gia_Man_t *p;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Gia_Obj_t *pGVar8;
  Gia_Obj_t *pGVar9;
  Vec_Ptr_t *pVVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  Vec_Ptr_t *pVVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  timespec ts;
  timespec local_48;
  long local_38;
  
  iVar4 = clock_gettime(3,&local_48);
  if (iVar4 < 0) {
    lVar15 = 1;
  }
  else {
    lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar15 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  if (pIfMan->vSwitching != (Vec_Int_t *)0x0) {
    __assert_fail("pIfMan->vSwitching == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcIf.c"
                  ,0x42,"void If_ManComputeSwitching(If_Man_t *)");
  }
  p = Gia_ManStart(pIfMan->vObjs->nSize);
  iVar4 = pIfMan->vObjs->nSize;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < iVar4 - 1U) {
    iVar11 = iVar4;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar11;
  local_38 = lVar15;
  if (iVar11 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)iVar11 << 2);
  }
  pVVar6->pArray = piVar7;
  Vec_IntPush(pVVar6,1);
  if (0 < pIfMan->vCis->nSize) {
    iVar4 = 0;
    do {
      pGVar8 = Gia_ManAppendObj(p);
      uVar17 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar17 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar17 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar9 = p->pObjs;
      if ((pGVar8 < pGVar9) || (pGVar9 + p->nObjs <= pGVar8)) goto LAB_002c8fb1;
      Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar9) >> 2) * -0x55555555);
      pGVar9 = p->pObjs;
      if ((pGVar8 < pGVar9) || (pGVar9 + p->nObjs <= pGVar8)) goto LAB_002c8fb1;
      Vec_IntPush(pVVar6,(int)((ulong)((long)pGVar8 - (long)pGVar9) >> 2) * 0x55555556);
      iVar4 = iVar4 + 1;
    } while (iVar4 < pIfMan->vCis->nSize);
  }
  pVVar10 = pIfMan->vObjs;
  if (0 < pVVar10->nSize) {
    lVar15 = 0;
    do {
      puVar3 = (uint *)pVVar10->pArray[lVar15];
      uVar1 = *puVar3;
      if ((uVar1 & 0xf) == 4) {
        iVar4 = *(int *)(*(long *)(puVar3 + 6) + 4);
        if (((long)iVar4 < 0) || (pVVar6->nSize <= iVar4)) goto LAB_002c8fd0;
        uVar20 = pVVar6->pArray[iVar4];
        if ((int)uVar20 < 0) goto LAB_002c8fef;
        uVar16 = *(uint *)(*(long *)(puVar3 + 8) + 4);
        if (((long)(int)uVar16 < 0) || ((uint)pVVar6->nSize <= uVar16)) goto LAB_002c8fd0;
        uVar16 = pVVar6->pArray[(int)uVar16];
        if ((int)uVar16 < 0) goto LAB_002c8fef;
        pGVar9 = Gia_ManAppendObj(p);
        uVar12 = uVar20 >> 1;
        uVar2 = p->nObjs;
        if ((int)uVar2 <= (int)uVar12) {
          __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                        ,0x2a2,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
        }
        uVar5 = uVar16 >> 1;
        if (uVar2 <= uVar5) {
          __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                        ,0x2a3,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
        }
        if ((uVar12 == uVar5) && (p->fGiaSimple == 0)) {
          __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                        ,0x2a4,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
        }
        uVar20 = uVar20 ^ uVar1 >> 4 & 1;
        uVar16 = uVar16 ^ uVar1 >> 5 & 1;
        pGVar8 = p->pObjs;
        iVar4 = (int)pGVar9;
        if (uVar20 < uVar16) {
          if (pGVar8 + uVar2 <= pGVar9 || pGVar9 < pGVar8) goto LAB_002c8fb1;
          uVar17 = *(ulong *)pGVar9;
          uVar13 = (ulong)((uVar20 & 1) << 0x1d |
                          ((uint)(iVar4 - (int)pGVar8) >> 2) * -0x55555555 - uVar12 & 0x1fffffff);
          *(ulong *)pGVar9 = uVar13 | uVar17 & 0xffffffffc0000000;
          pGVar8 = p->pObjs;
          if ((pGVar9 < pGVar8) || (pGVar8 + p->nObjs <= pGVar9)) goto LAB_002c8fb1;
          uVar17 = (ulong)(uVar16 & 1) << 0x3d |
                   (ulong)(((uint)(iVar4 - (int)pGVar8) >> 2) * -0x55555555 - uVar5 & 0x1fffffff) <<
                   0x20 | uVar13 | uVar17 & 0xc0000000c0000000;
        }
        else {
          if (pGVar8 + uVar2 <= pGVar9 || pGVar9 < pGVar8) goto LAB_002c8fb1;
          uVar13 = (ulong)(((uint)(iVar4 - (int)pGVar8) >> 2) * -0x55555555 - uVar12 & 0x1fffffff)
                   << 0x20;
          uVar17 = *(ulong *)pGVar9;
          uVar18 = (ulong)(uVar20 & 1) << 0x3d;
          *(ulong *)pGVar9 = uVar18 | uVar17 & 0xc0000000ffffffff | uVar13;
          pGVar8 = p->pObjs;
          if ((pGVar9 < pGVar8) || (pGVar8 + p->nObjs <= pGVar9)) goto LAB_002c8fb1;
          uVar17 = (ulong)((uVar16 & 1) << 0x1d) | uVar18 | uVar17 & 0xc0000000c0000000 | uVar13 |
                   (ulong)(((uint)(iVar4 - (int)pGVar8) >> 2) * -0x55555555 - uVar5 & 0x1fffffff);
        }
        *(ulong *)pGVar9 = uVar17;
        if (p->pFanData != (int *)0x0) {
          Gia_ObjAddFanout(p,pGVar9 + -(uVar17 & 0x1fffffff),pGVar9);
          Gia_ObjAddFanout(p,pGVar9 + -((ulong)*(uint *)&pGVar9->field_0x4 & 0x1fffffff),pGVar9);
        }
        if (p->fSweeper != 0) {
          uVar13 = *(ulong *)pGVar9 & 0x1fffffff;
          uVar17 = *(ulong *)pGVar9 >> 0x20 & 0x1fffffff;
          uVar18 = 0x4000000000000000;
          if (((uint)*(ulong *)(pGVar9 + -uVar13) >> 0x1e & 1) == 0) {
            uVar18 = 0x40000000;
          }
          *(ulong *)(pGVar9 + -uVar13) = uVar18 | *(ulong *)(pGVar9 + -uVar13);
          uVar18 = *(ulong *)(pGVar9 + -uVar17);
          uVar19 = 0x4000000000000000;
          if (((uint)uVar18 >> 0x1e & 1) == 0) {
            uVar19 = 0x40000000;
          }
          *(ulong *)(pGVar9 + -uVar17) = uVar19 | uVar18;
          uVar17 = *(ulong *)pGVar9;
          *(ulong *)pGVar9 =
               uVar17 & 0x7fffffffffffffff |
               (ulong)(((uint)(uVar17 >> 0x3d) ^ (uint)(uVar18 >> 0x3f)) &
                      ((uint)((ulong)*(undefined8 *)(pGVar9 + -uVar13) >> 0x3f) ^
                      (uint)(uVar17 >> 0x1d) & 7)) << 0x3f;
        }
        if (p->fBuiltInSim != 0) {
          uVar17 = *(ulong *)pGVar9;
          *(ulong *)pGVar9 =
               uVar17 & 0x7fffffffffffffff |
               (ulong)(((uint)(uVar17 >> 0x3d) ^
                       (uint)((ulong)*(undefined8 *)(pGVar9 + -(uVar17 >> 0x20 & 0x1fffffff)) >>
                             0x3f)) &
                      ((uint)((ulong)*(undefined8 *)(pGVar9 + -(uVar17 & 0x1fffffff)) >> 0x3f) ^
                      (uint)(uVar17 >> 0x1d) & 7)) << 0x3f;
          pGVar8 = p->pObjs;
          if ((pGVar9 < pGVar8) || (pGVar8 + p->nObjs <= pGVar9)) goto LAB_002c8fb1;
          Gia_ManBuiltInSimPerform(p,(int)((ulong)((long)pGVar9 - (long)pGVar8) >> 2) * -0x55555555)
          ;
        }
        if (p->vSuppWords != (Vec_Wrd_t *)0x0) {
          Gia_ManQuantSetSuppAnd(p,pGVar9);
        }
        pGVar8 = p->pObjs;
        if ((pGVar9 < pGVar8) || (pGVar8 + p->nObjs <= pGVar9)) goto LAB_002c8fb1;
        Vec_IntPush(pVVar6,(int)((ulong)((long)pGVar9 - (long)pGVar8) >> 2) * 0x55555556);
        pVVar10 = pIfMan->vObjs;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < pVVar10->nSize);
  }
  pVVar14 = pIfMan->vCos;
  if (0 < pVVar14->nSize) {
    lVar15 = 0;
    do {
      iVar4 = *(int *)(*(long *)((long)pVVar14->pArray[lVar15] + 0x18) + 4);
      if (((long)iVar4 < 0) || (pVVar6->nSize <= iVar4)) {
LAB_002c8fd0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar1 = pVVar6->pArray[iVar4];
      if ((int)uVar1 < 0) {
LAB_002c8fef:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar20 = uVar1 >> 1;
      if (p->nObjs <= (int)uVar20) {
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x30e,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      if ((~*(uint *)(p->pObjs + uVar20) & 0x1fffffff) != 0 && (int)*(uint *)(p->pObjs + uVar20) < 0
         ) {
        __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x30f,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      uVar16 = *pVVar14->pArray[lVar15];
      pGVar8 = Gia_ManAppendObj(p);
      uVar17 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar17 | 0x80000000;
      pGVar9 = p->pObjs;
      if ((pGVar8 < pGVar9) || (pGVar9 + p->nObjs <= pGVar8)) {
LAB_002c8fb1:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar13 = (ulong)(((uint)((int)pGVar8 - (int)pGVar9) >> 2) * -0x55555555 - uVar20 & 0x1fffffff)
      ;
      uVar18 = (ulong)(((uVar16 >> 4 ^ uVar1) & 1) << 0x1d);
      *(ulong *)pGVar8 = uVar18 | uVar17 & 0xffffffffc0000000 | 0x80000000 | uVar13;
      *(ulong *)pGVar8 =
           uVar18 | uVar17 & 0xe0000000c0000000 | 0x80000000 | uVar13 |
           (ulong)(p->vCos->nSize & 0x1fffffff) << 0x20;
      pGVar9 = p->pObjs;
      if ((pGVar8 < pGVar9) || (pGVar9 + p->nObjs <= pGVar8)) goto LAB_002c8fb1;
      Vec_IntPush(p->vCos,(int)((ulong)((long)pGVar8 - (long)pGVar9) >> 2) * -0x55555555);
      if (p->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p,pGVar8 + -(ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff),pGVar8);
      }
      pGVar9 = p->pObjs;
      if ((pGVar8 < pGVar9) || (pGVar9 + p->nObjs <= pGVar8)) goto LAB_002c8fb1;
      Vec_IntPush(pVVar6,(int)((ulong)((long)pGVar8 - (long)pGVar9) >> 2) * 0x55555556);
      lVar15 = lVar15 + 1;
      pVVar14 = pIfMan->vCos;
    } while (lVar15 < pVVar14->nSize);
    pVVar10 = pIfMan->vObjs;
  }
  if (pVVar6->nSize == pVVar10->nSize) {
    if (pVVar6->pArray != (int *)0x0) {
      free(pVVar6->pArray);
    }
    free(pVVar6);
    pVVar6 = Gia_ManComputeSwitchProbs(p,0x30,0x10,0);
    pIfMan->vSwitching = pVVar6;
    Gia_ManStop(p);
    if (pIfMan->pPars->fVerbose != 0) {
      iVar11 = 3;
      iVar4 = clock_gettime(3,&local_48);
      if (iVar4 < 0) {
        lVar15 = -1;
      }
      else {
        lVar15 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
      }
      lVar15 = lVar15 + local_38;
      Abc_Print(iVar11,"%s =","Computing switching activity");
      Abc_Print(iVar11,"%9.2f sec\n",(double)lVar15 / 1000000.0);
    }
    return;
  }
  __assert_fail("Vec_IntSize(vCopy) == If_ManObjNum(pIfMan)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcIf.c"
                ,0x57,"void If_ManComputeSwitching(If_Man_t *)");
}

Assistant:

void If_ManComputeSwitching( If_Man_t * pIfMan )
{
    abctime clk = Abc_Clock();
    Gia_Man_t * pNew;
    Vec_Int_t * vCopy;
    If_Obj_t * pIfObj;
    int i;
    assert( pIfMan->vSwitching == NULL );
    // create the new manager
    pNew = Gia_ManStart( If_ManObjNum(pIfMan) );
    vCopy = Vec_IntAlloc( If_ManObjNum(pIfMan) );
    // constant and inputs
    Vec_IntPush( vCopy, 1 );
    If_ManForEachCi( pIfMan, pIfObj, i )
        Vec_IntPush( vCopy, Gia_ManAppendCi(pNew) );
    // internal nodes
    If_ManForEachNode( pIfMan, pIfObj, i )
    {
        int iLit0 = Abc_LitNotCond( Vec_IntEntry(vCopy, If_ObjFanin0(pIfObj)->Id), If_ObjFaninC0(pIfObj) );
        int iLit1 = Abc_LitNotCond( Vec_IntEntry(vCopy, If_ObjFanin1(pIfObj)->Id), If_ObjFaninC1(pIfObj) );
        Vec_IntPush( vCopy, Gia_ManAppendAnd(pNew, iLit0, iLit1) );
    }
    // outputs
    If_ManForEachCo( pIfMan, pIfObj, i )
    {
        int iLit0 = Abc_LitNotCond( Vec_IntEntry(vCopy, If_ObjFanin0(pIfObj)->Id), If_ObjFaninC0(pIfObj) );
        Vec_IntPush( vCopy, Gia_ManAppendCo(pNew, iLit0) );
    }
    assert( Vec_IntSize(vCopy) == If_ManObjNum(pIfMan) );
    Vec_IntFree( vCopy );
    // compute switching activity
    pIfMan->vSwitching = Gia_ManComputeSwitchProbs( pNew, 48, 16, 0 );
    Gia_ManStop( pNew );
    if ( pIfMan->pPars->fVerbose )
        Abc_PrintTime( 1, "Computing switching activity", Abc_Clock() - clk );
}